

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

ComponentHandle<Counter,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Counter,Counter_const&>(EntityManager *this,Id id,Counter *args)

{
  ComponentHandle<Counter,_entityx::EntityManager> CVar1;
  Family __position;
  Pool<Counter,_8192UL> *pPVar2;
  ulong uVar3;
  Entity local_40;
  ComponentHandle<Counter,_entityx::EntityManager> component;
  
  __position = Component<Counter>::family();
  pPVar2 = accomodate_component<Counter>(this);
  uVar3 = id.id_ & 0xffffffff;
  *(int *)(*(long *)(*(long *)&pPVar2->field_0x8 + (uVar3 / *(ulong *)&pPVar2->field_0x28) * 8) +
          (uVar3 % *(ulong *)&pPVar2->field_0x28) * *(long *)&pPVar2->field_0x20) = args->counter;
  Catch::clara::std::bitset<64UL>::set
            ((bitset<64UL> *)(uVar3 * 8 + *(long *)(this + 0x48)),__position,true);
  local_40.manager_ = this;
  local_40.id_.id_ = id.id_;
  component.manager_ = this;
  component.id_.id_ = id.id_;
  EventManager::
  emit<entityx::ComponentAddedEvent<Counter>,entityx::Entity,entityx::ComponentHandle<Counter,entityx::EntityManager>&>
            (*(EventManager **)(this + 0x10),&local_40,&component);
  CVar1.id_.id_ = component.id_.id_;
  CVar1.manager_ = component.manager_;
  return CVar1;
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }